

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O1

void __thiscall
vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::makePageResident
          (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *this,size_t pageNdx)

{
  ulong *puVar1;
  pointer pBVar2;
  pointer pBVar3;
  Resource *pRVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  
  pBVar2 = (this->m_elements).
           super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar3 = (this->m_elements).
           super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = (*((this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
             m_data.ptr)->_vptr_Resource[4])();
  if (pageNdx * 0x2000 != (long)iVar5) {
    pRVar4 = (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
             m_data.ptr;
    (*pRVar4->_vptr_Resource[5])(pRVar4,pageNdx * 0x2000 & 0xffffffff);
  }
  uVar7 = (long)pBVar2 - (long)(pBVar3 + pageNdx * 0x400);
  if (0x1fff < uVar7) {
    uVar7 = 0x2000;
  }
  pRVar4 = (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
           m_data.ptr;
  (*pRVar4->_vptr_Resource[2])
            (pRVar4,(this->m_elements).
                    super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                    ._M_impl.super__Vector_impl_data._M_start + pageNdx * 0x400,uVar7 & 0xffffffff);
  sVar6 = pageNdx + 0x3f;
  if (-1 < (long)pageNdx) {
    sVar6 = pageNdx;
  }
  puVar1 = (this->m_isPageResident).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)sVar6 >> 6) +
           (ulong)((pageNdx & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)pageNdx & 0x3f);
  return;
}

Assistant:

void LazyResource<Element>::makePageResident (size_t pageNdx)
{
	const size_t	pageSize		= (size_t)(1<<ELEMENTS_PER_PAGE_LOG2)*sizeof(Element);
	const size_t	pageOffset		= pageNdx*pageSize;
	const size_t	numBytesToRead	= de::min(m_elements.size()*sizeof(Element) - pageOffset, pageSize);

	DE_ASSERT(!isPageResident(pageNdx));

	if ((size_t)m_resource->getPosition() != pageOffset)
		m_resource->setPosition((int)pageOffset);

	m_resource->read((deUint8*)&m_elements[pageNdx << ELEMENTS_PER_PAGE_LOG2], (int)numBytesToRead);
	m_isPageResident[pageNdx] = true;
}